

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

uint64_t get_uintX(uint8_t *p,int length)

{
  byte bVar1;
  uint64_t uVar2;
  
  uVar2 = 0;
  for (; 0 < length; length = length + -1) {
    bVar1 = *p;
    p = p + 1;
    uVar2 = uVar2 << 8 | (ulong)bVar1;
  }
  return uVar2;
}

Assistant:

static uint64_t get_uintX(const uint8_t *p, int length) {
    uint64_t value = 0;
    while (length-- > 0) {
        value <<= 8;
        value += *p++;
    }
    return value;
}